

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O3

void __thiscall docs::DocsParser::createDoc(DocsParser *this,Doc *doc)

{
  Token *pTVar1;
  TextPos *pTVar2;
  Token *pTVar3;
  pointer puVar4;
  LexData *pLVar5;
  int iVar6;
  TokenKind TVar7;
  Token *pTVar8;
  Token *pTVar9;
  undefined8 uVar10;
  char cVar11;
  _Alloc_hider _Var12;
  int iVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  int iVar15;
  string type;
  string id;
  Token commentTok;
  string local_118;
  Doc *local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  Token local_48;
  
  pTVar8 = (this->tok_it)._M_current;
  pTVar9 = (this->tok_end)._M_current;
  if (pTVar8 == pTVar9) {
LAB_001081a3:
    (this->tok).kind = Eof;
    (this->tok).pos.line = 0;
    (this->tok).pos.col = 0;
    (this->tok).i = 0;
    (this->tok).j = 0;
    return;
  }
  pTVar1 = &this->tok;
  pTVar2 = &(this->tok).pos;
  local_f8 = doc;
LAB_00107b11:
  paVar14 = &local_118.field_2;
  (this->tok).j = pTVar8->j;
  iVar15 = (pTVar8->pos).line;
  uVar10 = *(undefined8 *)&(pTVar8->pos).col;
  pTVar1->kind = pTVar8->kind;
  (pTVar1->pos).line = iVar15;
  *(undefined8 *)&(this->tok).pos.col = uVar10;
  pTVar3 = pTVar8 + 1;
  (this->tok_it)._M_current = pTVar3;
  TVar7 = (this->tok).kind;
  if (TVar7 == Comment) {
    local_48.j = (this->tok).j;
    local_48.kind = pTVar1->kind;
    local_48.pos.line = (pTVar1->pos).line;
    local_48._8_8_ = *(undefined8 *)&(this->tok).pos.col;
    if (pTVar3 == pTVar9) {
      pTVar1->kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
      return;
    }
    (this->tok).j = pTVar8[1].j;
    iVar15 = (pTVar3->pos).line;
    uVar10 = *(undefined8 *)&pTVar8[1].pos.col;
    pTVar1->kind = pTVar3->kind;
    (pTVar1->pos).line = iVar15;
    *(undefined8 *)&(this->tok).pos.col = uVar10;
    pTVar3 = pTVar8 + 2;
    (this->tok_it)._M_current = pTVar3;
    TVar7 = (this->tok).kind;
    if (TVar7 == Identifier) {
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_118._M_dataplus._M_p = (pointer)paVar14;
      if (pTVar3 == pTVar9) {
LAB_00107c66:
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
      }
      else {
        (this->tok).j = pTVar8[2].j;
        iVar15 = (pTVar3->pos).line;
        uVar10 = *(undefined8 *)&pTVar8[2].pos.col;
        pTVar1->kind = pTVar3->kind;
        (pTVar1->pos).line = iVar15;
        *(undefined8 *)&(this->tok).pos.col = uVar10;
        (this->tok_it)._M_current = pTVar8 + 3;
        TVar7 = (this->tok).kind;
        if (((TVar7 == Punctuator) && ((this->tok).i == 0x3a)) && ((this->tok).j == 0x3a)) {
          std::__cxx11::string::append((char *)&local_118);
          pTVar8 = (this->tok_it)._M_current;
          if (pTVar8 == (this->tok_end)._M_current) goto LAB_00107c66;
          (this->tok).j = pTVar8->j;
          iVar15 = (pTVar8->pos).line;
          uVar10 = *(undefined8 *)&(pTVar8->pos).col;
          pTVar1->kind = pTVar8->kind;
          (pTVar1->pos).line = iVar15;
          *(undefined8 *)&(this->tok).pos.col = uVar10;
          (this->tok_it)._M_current = pTVar8 + 1;
          TVar7 = (this->tok).kind;
        }
        if (TVar7 == Identifier) goto LAB_00107c88;
      }
      error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
LAB_00107c88:
      puVar4 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_f0._0_8_ = local_f0 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)local_f0,puVar4 + (this->tok).i,puVar4 + (this->tok).j);
      std::__cxx11::string::_M_append((char *)&local_118,local_f0._0_8_);
      while( true ) {
        if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        pTVar8 = (this->tok_it)._M_current;
        if (pTVar8 == (this->tok_end)._M_current) goto LAB_00107f93;
        (this->tok).j = pTVar8->j;
        iVar15 = (pTVar8->pos).line;
        uVar10 = *(undefined8 *)&(pTVar8->pos).col;
        pTVar1->kind = pTVar8->kind;
        (pTVar1->pos).line = iVar15;
        *(undefined8 *)&(this->tok).pos.col = uVar10;
        (this->tok_it)._M_current = pTVar8 + 1;
        TVar7 = (this->tok).kind;
        if (((TVar7 != Punctuator) || ((this->tok).i != 0x3a)) || ((this->tok).j != 0x3a)) break;
        std::__cxx11::string::append((char *)&local_118);
        pTVar8 = (this->tok_it)._M_current;
        if (pTVar8 == (this->tok_end)._M_current) {
          pTVar1->kind = Eof;
          pTVar2->line = 0;
          pTVar2->col = 0;
          (this->tok).i = 0;
          (this->tok).j = 0;
LAB_00107d6d:
          error<char_const(&)[30]>(this,(char (*) [30])"expecting identifier after ::");
        }
        else {
          (this->tok).j = pTVar8->j;
          iVar15 = (pTVar8->pos).line;
          iVar13 = (pTVar8->pos).col;
          iVar6 = pTVar8->i;
          pTVar1->kind = pTVar8->kind;
          (this->tok).pos.line = iVar15;
          (this->tok).pos.col = iVar13;
          (this->tok).i = iVar6;
          (this->tok_it)._M_current = pTVar8 + 1;
          if ((this->tok).kind != Identifier) goto LAB_00107d6d;
        }
        puVar4 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f0._0_8_ = local_f0 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)local_f0,puVar4 + (this->tok).i,puVar4 + (this->tok).j);
        std::__cxx11::string::_M_append((char *)&local_118,local_f0._0_8_);
      }
      do {
        cVar11 = (char)&local_118;
        if (TVar7 == Punctuator) {
          if ((((this->tok).i - 0x26U & 0xfffffffb) != 0) || ((this->tok).j != 0))
          goto LAB_00108043;
          std::__cxx11::string::push_back(cVar11);
        }
        else {
          if (TVar7 == Eof) goto LAB_00108043;
          iVar15 = (this->tok).i;
          if ((TVar7 != Keyword) || (iVar15 != 0x11)) goto LAB_0010803e;
          std::__cxx11::string::push_back(cVar11);
          std::__cxx11::string::_M_append
                    ((char *)&local_118,
                     (ulong)keywords_id_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(this->tok).i]._M_dataplus.
                            _M_p);
        }
        pTVar8 = (this->tok_it)._M_current;
        if (pTVar8 == (this->tok_end)._M_current) {
LAB_00107f93:
          pTVar1->kind = Eof;
          pTVar2->line = 0;
          pTVar2->col = 0;
          (this->tok).i = 0;
          (this->tok).j = 0;
          TVar7 = Eof;
        }
        else {
          (this->tok).j = pTVar8->j;
          iVar15 = (pTVar8->pos).line;
          uVar10 = *(undefined8 *)&(pTVar8->pos).col;
          pTVar1->kind = pTVar8->kind;
          (pTVar1->pos).line = iVar15;
          *(undefined8 *)&(this->tok).pos.col = uVar10;
          (this->tok_it)._M_current = pTVar8 + 1;
          TVar7 = (this->tok).kind;
        }
      } while( true );
    }
    if (TVar7 != Keyword) {
      if (TVar7 == Eof) {
        return;
      }
      goto switchD_00107bb1_caseD_5;
    }
    switch((this->tok).i) {
    case 3:
    case 4:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0x11:
    case 0x14:
    case 0x15:
    case 0x1b:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x23:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x34:
    case 0x38:
    case 0x39:
    case 0x3b:
    case 0x40:
    case 0x42:
    case 0x46:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
      if (pTVar3 == pTVar9) {
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
        iVar13 = 0;
        iVar15 = 0;
LAB_00107dd5:
        error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
      }
      else {
        (this->tok).j = pTVar8[2].j;
        iVar15 = pTVar8[2].pos.line;
        iVar13 = pTVar8[2].pos.col;
        iVar6 = pTVar8[2].i;
        pTVar1->kind = pTVar3->kind;
        (this->tok).pos.line = iVar15;
        (this->tok).pos.col = iVar13;
        (this->tok).i = iVar6;
        (this->tok_it)._M_current = pTVar8 + 3;
        iVar15 = (this->tok).i;
        iVar13 = (this->tok).j;
        if ((this->tok).kind != Identifier) goto LAB_00107dd5;
      }
      pLVar5 = this->data;
      puVar4 = (pLVar5->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&local_118,puVar4 + iVar15,puVar4 + iVar13);
      make_section((DocSection *)local_f0,pLVar5,&local_48,&local_118,
                   keywords_id_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
      std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::
      emplace_back<docs::DocSection>(&local_f8->sections,(DocSection *)local_f0);
LAB_00107e43:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      uVar10 = local_d8._M_allocated_capacity;
      _Var12._M_p = (pointer)local_f0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._8_8_ != &local_d8) goto LAB_00108170;
      goto LAB_00108178;
    case 0xc:
    case 0x1e:
    case 0x2c:
    case 0x3e:
    case 0x49:
      if (pTVar3 != pTVar9) {
        (this->tok).j = pTVar8[2].j;
        iVar15 = pTVar8[2].pos.line;
        iVar13 = pTVar8[2].pos.col;
        iVar6 = pTVar8[2].i;
        pTVar1->kind = pTVar3->kind;
        (this->tok).pos.line = iVar15;
        (this->tok).pos.col = iVar13;
        (this->tok).i = iVar6;
        (this->tok_it)._M_current = pTVar8 + 3;
        iVar15 = (this->tok).i;
        if ((this->tok).kind != Identifier) goto LAB_00107f68;
        pLVar5 = this->data;
        puVar4 = (pLVar5->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_118._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)&local_118,puVar4 + iVar15,puVar4 + (this->tok).j);
        make_section((DocSection *)local_f0,pLVar5,&local_48,&local_118,
                     keywords_id_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
        std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::
        emplace_back<docs::DocSection>(&local_f8->sections,(DocSection *)local_f0);
        goto LAB_00107e43;
      }
      pTVar1->kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
      iVar15 = 0;
LAB_00107f68:
      local_f0._0_8_ =
           keywords_id_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_dataplus._M_p;
      error<char_const(&)[30],char_const*>
                (this,(char (*) [30])"expecting identifier after %s",(char **)local_f0);
    }
    goto switchD_00107bb1_caseD_5;
  }
  pTVar8 = pTVar3;
  if (TVar7 == Eof) {
    return;
  }
  goto LAB_00108197;
LAB_0010803e:
  if (TVar7 != Identifier) {
LAB_00108043:
    local_f0._0_8_ = local_118._M_dataplus._M_p;
    error<char_const(&)[35],char_const*>
              (this,(char (*) [35])"expecting identifier after type %s",(char **)local_f0);
    iVar15 = (this->tok).i;
  }
  puVar4 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)&local_68,puVar4 + iVar15,puVar4 + (this->tok).j);
  make_section((DocSection *)local_f0,this->data,&local_48,&local_68,&local_118);
  std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
            (&local_f8->sections,(DocSection *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &local_d8) {
    operator_delete((void *)local_f0._8_8_,local_d8._M_allocated_capacity + 1);
  }
  uVar10 = local_68.field_2._M_allocated_capacity;
  _Var12._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00108170:
    operator_delete(_Var12._M_p,uVar10 + 1);
  }
LAB_00108178:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
switchD_00107bb1_caseD_5:
  pTVar8 = (this->tok_it)._M_current;
  pTVar9 = (this->tok_end)._M_current;
LAB_00108197:
  if (pTVar8 == pTVar9) goto LAB_001081a3;
  goto LAB_00107b11;
}

Assistant:

void createDoc(Doc& doc) {
    while (next_token().kind != TokenKind::Eof) {
      // Discard tokens until we find a comment, which might be
      // included in the docs.
      if (!is(TokenKind::Comment))
        continue;

      Token commentTok = tok;
      tok = next_token();
      if (eof()) // end of tokens (a comment at the end of file, maybe commenting the file?)
        break;

      switch (tok.kind) {
        case TokenKind::Keyword:
          switch (tok.i) {
            // Structures and namespaces
            case key_class:
            case key_struct:
            case key_enum:
            case key_union:
            case key_namespace: {
              Token idTok = next_token();
              if (!is(TokenKind::Identifier)) {
                error("expecting identifier after %s",
                      keywords_id[int(tok.i)].c_str());
                break;
              }

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(idTok),
                             keywords_id[int(tok.i)]));
              break;
            }
              // Variables or functions
            case key_auto:
            case key_bool:
            case key_char:
            case key_char16_t:
            case key_char32_t:
            case key_char8_t:
            case key_const:
            case key_constexpr:
            case key_constinit:
            case key_double:
            case key_explicit:
            case key_export:
            case key_extern:
            case key_float:
            case key_inline:
            case key_int:
            case key_long:
            case key_mutable:
            case key_register:
            case key_short:
            case key_signed:
            case key_static:
            case key_template:
            case key_thread_local:
            case key_typedef:
            case key_unsigned:
            case key_using:
            case key_virtual:
            case key_void:
            case key_volatile:
            case key_wchar_t: {
              Token id_tok = next_token();
              if (!is(TokenKind::Identifier))
                error("expecting identifier");

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(id_tok),
                             keywords_id[int(tok.i)]));
              break;
            }
          }
          break;
          // A user defined type to define a return value of a function or a variable type
        case TokenKind::Identifier: {
          Token firstTok = tok;
          std::string type;

          // TODO types that start with "const" go to the keyword
          //      case, or with "::" go to punctuator case

          tok = next_token();
          if (tok.is_double_colon()) {
            type += "::";
            tok = next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier");

          type += data.id_text(tok);
          next_token();

          while (tok.is_double_colon()) {
            type += "::";
            next_token();
            if (!is(TokenKind::Identifier))
              error("expecting identifier after ::");

            type += data.id_text(tok);
            next_token();
          }

          while (!eof() &&
                 // Pointers and references
                 ((is(TokenKind::Punctuator) &&
                   ((tok.i == '*' && tok.j == 0) ||
                    (tok.i == '&' && tok.j == 0)))
                  ||
                  // const
                  (tok.is_const_keyword()))) {
            if (is(TokenKind::Keyword)) {
              type.push_back(' ');
              type += keywords_id[tok.i];
            }
            else
              type.push_back(tok.i); // Add '*' or '&'
            next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier after type %s", type.c_str());

          std::string id(data.id_text(tok));

          doc.sections.push_back(
            make_section(data, commentTok, id, type));
          break;
        }
      }
    }
  }